

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

int check_posix_name(PCRE2_SPTR8 ptr,int len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char *str2;
  
  str2 = "alpha";
  lVar3 = 0;
  do {
    bVar1 = "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x04\x06"[lVar3];
    if ((uint)bVar1 == len) {
      iVar2 = _pcre2_strncmp_c8_8(ptr,str2,(ulong)(uint)len);
      if (iVar2 == 0) goto LAB_00116da8;
    }
    str2 = str2 + (ulong)bVar1 + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xe);
  lVar3 = 0xffffffff;
LAB_00116da8:
  return (int)lVar3;
}

Assistant:

static int
check_posix_name(PCRE2_SPTR ptr, int len)
{
const char *pn = posix_names;
register int yield = 0;
while (posix_name_lengths[yield] != 0)
  {
  if (len == posix_name_lengths[yield] &&
    PRIV(strncmp_c8)(ptr, pn, (unsigned int)len) == 0) return yield;
  pn += posix_name_lengths[yield] + 1;
  yield++;
  }
return -1;
}